

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.cpp
# Opt level: O2

void __thiscall YdiskRestClient::saveFromUrl(YdiskRestClient *this,string *urlFrom,string *pathTo)

{
  undefined8 extraout_RAX;
  char *this_00;
  YdiskRestClient *this_01;
  Client *this_02;
  string empty_body;
  shared_ptr<httplib::Response> r;
  string url;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [64];
  string local_58;
  
  this_00 = "/v1/disk/resources/upload?url=";
  std::__cxx11::string::string
            ((string *)(local_98 + 0x20),"/v1/disk/resources/upload?url=",(allocator *)&local_b8);
  url_encode((string *)&stack0xffffffffffffffc8,(YdiskRestClient *)this_00,urlFrom);
  this_01 = (YdiskRestClient *)&stack0xffffffffffffffc8;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_01,
                 "&path=");
  url_encode(&local_58,this_01,pathTo);
  std::operator+(&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                 &local_58);
  std::__cxx11::string::append((string *)(local_98 + 0x20));
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  this_02 = (Client *)local_98;
  httplib::Client::Post
            (this_02,(char *)this->http_client,(Headers *)local_98._32_8_,(string *)&this->headers,
             (char *)&local_b8);
  if (((Response *)local_98._0_8_ != (Response *)0x0) && (*(int *)(local_98._0_8_ + 0x20) == 0xca))
  {
    wait_success_operation(this,(string *)(local_98._0_8_ + 0x58));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)(local_98 + 0x20));
    return;
  }
  throw_response_error((YdiskRestClient *)this_02,(Response *)local_98._0_8_);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)(local_98 + 0x20));
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void YdiskRestClient::saveFromUrl(std::string urlFrom, std::string pathTo)
{
    std::string url("/v1/disk/resources/upload?url=");
    url += url_encode(urlFrom) + "&path=" + url_encode(pathTo);
    std::string empty_body;
    auto r = http_client->Post(url.c_str(), headers, empty_body, "text/plain");

    if(r.get() && r->status==202){
        wait_success_operation(r->body);
        return;
    } else {
        throw_response_error(r.get());
    }
}